

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHdrWrapper.cpp
# Opt level: O0

QString * __thiscall
FileHdrWrapper::getFieldName(QString *__return_storage_ptr__,FileHdrWrapper *this,size_t fieldId)

{
  Executable *pEVar1;
  bool bVar2;
  PEFile *local_58;
  PEFile *myPe;
  size_t fieldId_local;
  FileHdrWrapper *this_local;
  
  switch(fieldId) {
  case 0:
    QString::QString(__return_storage_ptr__,"Machine");
    break;
  case 1:
    QString::QString(__return_storage_ptr__,"Sections Count");
    break;
  case 2:
    pEVar1 = (this->super_PEElementWrapper).super_ExeElementWrapper.m_Exe;
    if (pEVar1 == (Executable *)0x0) {
      local_58 = (PEFile *)0x0;
    }
    else {
      local_58 = (PEFile *)__dynamic_cast(pEVar1,&Executable::typeinfo,&PEFile::typeinfo,0);
    }
    if ((local_58 == (PEFile *)0x0) || (bVar2 = PEFile::isReproBuild(local_58), !bVar2)) {
      QString::QString(__return_storage_ptr__,"Time Date Stamp");
    }
    else {
      QString::QString(__return_storage_ptr__,"ReproChecksum");
    }
    break;
  case 3:
    QString::QString(__return_storage_ptr__,"Ptr to Symbol Table");
    break;
  case 4:
    QString::QString(__return_storage_ptr__,"Num. of Symbols");
    break;
  case 5:
    QString::QString(__return_storage_ptr__,"Size of OptionalHeader");
    break;
  case 6:
    QString::QString(__return_storage_ptr__,"Characteristics");
    break;
  default:
    QString::QString(__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

QString FileHdrWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
         case MACHINE: return("Machine");
         case SEC_NUM: return ("Sections Count");
         case TIMESTAMP: {
            PEFile* myPe = dynamic_cast<PEFile*>(this->m_Exe);
            if (myPe && myPe->isReproBuild()) {
                return "ReproChecksum";
            }
            return("Time Date Stamp");
         }
         case SYMBOL_PTR: return("Ptr to Symbol Table");
         case SYMBOL_NUM: return("Num. of Symbols");
         case OPTHDR_SIZE: return("Size of OptionalHeader");
         case CHARACT: return("Characteristics");
    }
    return "";
}